

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O0

amqp_bytes_t amqp_bytes_malloc_dup(amqp_bytes_t src)

{
  amqp_bytes_t aVar1;
  void *__dest;
  void *in_RSI;
  size_t in_RDI;
  amqp_bytes_t result;
  
  __dest = malloc(in_RDI);
  if (__dest != (void *)0x0) {
    memcpy(__dest,in_RSI,in_RDI);
  }
  aVar1.bytes = __dest;
  aVar1.len = in_RDI;
  return aVar1;
}

Assistant:

amqp_bytes_t amqp_bytes_malloc_dup(amqp_bytes_t src)
{
  amqp_bytes_t result;
  result.len = src.len;
  result.bytes = malloc(src.len);
  if (result.bytes != NULL) {
    memcpy(result.bytes, src.bytes, src.len);
  }
  return result;
}